

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::anon_unknown_0::AnsiPortListBuilder::add
          (AnsiPortListBuilder *this,DeclaratorSyntax *decl,ArgumentDirection direction,
          DataTypeSyntax *type,NetType *netType,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attrs)

{
  string_view arg;
  string_view arg_00;
  string_view name;
  SourceRange sourceRange;
  bool bVar1;
  SourceLocation this_00;
  Symbol *pSVar2;
  DeclaredType *this_01;
  ExpressionSyntax *syntax;
  SourceLocation loc;
  Symbol *in_RCX;
  undefined4 in_EDX;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  SourceLocation in_R8;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  ValueSymbol *symbol_1;
  Symbol *symbol;
  PortSymbol *port;
  Compilation *in_stack_fffffffffffffe88;
  SourceLocation in_stack_fffffffffffffe90;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
  *in_stack_fffffffffffffe98;
  ValueSymbol *in_stack_fffffffffffffea0;
  bool *in_stack_fffffffffffffea8;
  Compilation *args_2;
  Compilation *args_1;
  Symbol *this_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed8;
  SyntaxNode *in_stack_fffffffffffffee0;
  Scope *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  NetSymbol *local_e8;
  Scope *in_stack_ffffffffffffff30;
  SourceLocation in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  DiagCode code;
  Scope *this_03;
  SourceLocation SVar5;
  
  code = SUB84((ulong)in_stack_ffffffffffffff40 >> 0x20,0);
  this_02 = (Symbol *)&stack0x00000008;
  args_1 = in_RDI->compilation;
  sVar3 = parsing::Token::valueText((Token *)in_stack_fffffffffffffea0);
  this_03 = (Scope *)sVar3._M_str;
  parsing::Token::location((Token *)(in_RSI + 1));
  this_00 = (SourceLocation)
            BumpAllocator::
            emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,bool>
                      ((BumpAllocator *)this_02,
                       (basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                       (SourceLocation *)args_1,in_stack_fffffffffffffea8);
  *(undefined4 *)((long)this_00 + 0x50) = in_EDX;
  Symbol::setSyntax((Symbol *)this_00,in_RSI);
  Symbol::setAttributes(this_02,in_RDI,in_stack_fffffffffffffec8);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)((long)this_00 + 8));
  if (!bVar1) {
    if ((*(int *)((long)this_00 + 0x50) == 2) && (in_R8 == (SourceLocation)0x0)) {
      Scope::addDiag(in_stack_ffffffffffffff30,code,in_stack_ffffffffffffff38);
      arg._M_str = (char *)in_stack_fffffffffffffee0;
      arg._M_len = in_stack_fffffffffffffed8;
      Diagnostic::operator<<
                ((Diagnostic *)in_stack_fffffffffffffec8._M_extent._M_extent_value._M_extent_value,
                 arg);
    }
    else if ((*(int *)((long)this_00 + 0x50) == 2) && (*(int *)((long)in_R8 + 0x80) == 0xc)) {
      Scope::addDiag(in_stack_ffffffffffffff30,code,in_stack_ffffffffffffff38);
      arg_00._M_str = (char *)in_stack_fffffffffffffee0;
      arg_00._M_len = in_stack_fffffffffffffed8;
      Diagnostic::operator<<
                ((Diagnostic *)in_stack_fffffffffffffec8._M_extent._M_extent_value._M_extent_value,
                 arg_00);
    }
    else if ((*(int *)((long)this_00 + 0x50) == 3) && (in_R8 != (SourceLocation)0x0)) {
      Scope::addDiag(in_stack_ffffffffffffff30,code,in_stack_ffffffffffffff38);
      sVar3._M_str = (char *)in_stack_fffffffffffffee0;
      sVar3._M_len = in_stack_fffffffffffffed8;
      Diagnostic::operator<<
                ((Diagnostic *)in_stack_fffffffffffffec8._M_extent._M_extent_value._M_extent_value,
                 sVar3);
    }
  }
  args_2 = in_RDI->compilation;
  bitmask<slang::ast::CompilationFlags>::bitmask
            ((bitmask<slang::ast::CompilationFlags> *)&stack0xffffffffffffff3c,AllowMergingAnsiPorts
            );
  bVar1 = Compilation::hasFlag
                    (in_stack_fffffffffffffe88,
                     (bitmask<slang::ast::CompilationFlags>)in_stack_fffffffffffffe90._4_4_);
  if (((bVar1) &&
      (name._M_len._4_4_ = in_stack_fffffffffffffef4, name._M_len._0_4_ = in_stack_fffffffffffffef0,
      name._M_str = in_stack_fffffffffffffef8, pSVar2 = Scope::find(in_stack_fffffffffffffee8,name),
      pSVar2 != (Symbol *)0x0)) && ((pSVar2->kind == Variable || (pSVar2->kind == Net)))) {
    *(Symbol **)((long)this_00 + 0x40) = pSVar2;
  }
  if (*(long *)((long)this_00 + 0x40) == 0) {
    if (in_R8 == (SourceLocation)0x0) {
      local_e8 = (NetSymbol *)
                 BumpAllocator::
                 emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                           ((BumpAllocator *)this_02,
                            (basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                            (SourceLocation *)args_1,(VariableLifetime *)args_2);
    }
    else {
      local_e8 = BumpAllocator::
                 emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::NetType_const&>
                           ((BumpAllocator *)this_02,
                            (basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                            (SourceLocation *)args_1,(NetType *)args_2);
    }
    if (in_RCX == (Symbol *)0x0) {
      bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                        ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                         0x516083);
      if (!bVar1) {
        ValueSymbol::getDeclaredType((ValueSymbol *)in_stack_fffffffffffffe88);
        this_01 = not_null<slang::ast::DeclaredType_*>::operator->
                            ((not_null<slang::ast::DeclaredType_*> *)0x5160a9);
        DeclaredType::setDimensionSyntax
                  (this_01,(SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                           &in_RSI[1].previewNode);
      }
    }
    else {
      ValueSymbol::setDeclaredType
                (in_stack_fffffffffffffea0,(DataTypeSyntax *)in_stack_fffffffffffffe98,
                 (SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_stack_fffffffffffffe90);
    }
    Symbol::setSyntax((Symbol *)local_e8,in_RSI);
    Symbol::setAttributes(this_02,in_RDI,in_stack_fffffffffffffec8);
    *(NetSymbol **)((long)this_00 + 0x40) = local_e8;
    SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
    emplace_back<slang::ast::ValueSymbol*&,slang::ast::PortSymbol*&>
              (in_stack_fffffffffffffe98,(ValueSymbol **)in_stack_fffffffffffffe90,
               (PortSymbol **)in_stack_fffffffffffffe88);
  }
  SVar5 = this_00;
  if (*(long *)(in_RSI + 4) != 0) {
    if ((in_R8 == (SourceLocation)0x0) || (*(int *)((long)in_R8 + 0x80) != 0xd)) {
      syntax = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)0x5161da);
      loc = parsing::Token::location((Token *)(*(long *)(in_RSI + 4) + 0x18));
      PortSymbol::setInitializerSyntax((PortSymbol *)this_00,syntax,loc);
      in_stack_fffffffffffffe90 = this_00;
    }
    else {
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffee0);
      sourceRange.endLoc = in_R8;
      sourceRange.startLoc = this_00;
      Scope::addDiag(this_03,SUB84((ulong)in_RCX >> 0x20,0),sourceRange);
      SVar5 = this_00;
    }
  }
  *(undefined4 *)&in_RDI->firstMember = in_EDX;
  in_RDI->lastMember = in_RCX;
  *(SourceLocation *)&in_RDI->deferredMemberIndex = in_R8;
  in_RDI->importData = (WildcardImportData *)0x0;
  bVar4 = sv((char *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
  in_RDI[1].compilation = (Compilation *)bVar4._M_len;
  in_RDI[1].thisSym = (Symbol *)bVar4._M_str;
  *(undefined1 *)&in_RDI[1].nameMap = 0;
  return (Symbol *)SVar5;
}

Assistant:

Symbol* add(const DeclaratorSyntax& decl, ArgumentDirection direction,
                const DataTypeSyntax* type, const NetType* netType,
                std::span<const AttributeInstanceSyntax* const> attrs) {
        auto port = comp.emplace<PortSymbol>(decl.name.valueText(), decl.name.location(),
                                             /* isAnsiPort */ true);
        port->direction = direction;
        port->setSyntax(decl);
        port->setAttributes(scope, attrs);

        if (!port->name.empty()) {
            if (port->direction == ArgumentDirection::InOut && !netType) {
                scope.addDiag(diag::InOutPortCannotBeVariable, port->location) << port->name;
            }
            else if (port->direction == ArgumentDirection::InOut &&
                     netType->netKind == NetType::UWire) {
                scope.addDiag(diag::InOutUWirePort, port->location) << port->name;
            }
            else if (port->direction == ArgumentDirection::Ref && netType) {
                scope.addDiag(diag::RefPortMustBeVariable, port->location) << port->name;
            }
        }

        // Support a compatibility option which allows ANSI ports to still look
        // up and connect to an identically named net or variable declared in
        // the definition body instead of creating a new symbol internally.
        if (comp.hasFlag(CompilationFlags::AllowMergingAnsiPorts)) {
            if (auto symbol = scope.find(port->name);
                symbol &&
                (symbol->kind == SymbolKind::Variable || symbol->kind == SymbolKind::Net)) {
                port->internalSymbol = symbol;
            }
        }

        // Create a new symbol to represent this port internally to the instance.
        if (!port->internalSymbol) {
            ValueSymbol* symbol;
            if (netType) {
                symbol = comp.emplace<NetSymbol>(port->name, port->location, *netType);
            }
            else {
                symbol = comp.emplace<VariableSymbol>(port->name, port->location,
                                                      VariableLifetime::Static);
            }

            if (type) {
                symbol->setDeclaredType(*type, decl.dimensions);
            }
            else {
                SLANG_ASSERT(netType);
                if (!decl.dimensions.empty())
                    symbol->getDeclaredType()->setDimensionSyntax(decl.dimensions);
            }

            symbol->setSyntax(decl);
            symbol->setAttributes(scope, attrs);
            port->internalSymbol = symbol;
            implicitMembers.emplace_back(symbol, port);
        }

        if (decl.initializer) {
            if (netType && netType->netKind == NetType::Interconnect) {
                scope.addDiag(diag::InterconnectInitializer, decl.initializer->sourceRange());
            }
            else {
                port->setInitializerSyntax(*decl.initializer->expr,
                                           decl.initializer->equals.location());
            }
        }

        // Remember the properties of this port in case the next port wants to inherit from it.
        lastDirection = direction;
        lastType = type;
        lastNetType = netType;
        lastInterface = nullptr;
        lastModport = ""sv;
        lastGenericIface = false;

        return port;
    }